

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void nng_fini(void)

{
  _Bool _Var1;
  
  do {
    _Var1 = nni_atomic_flag_test_and_set(&init_busy);
  } while (_Var1);
  init_count = init_count - 1;
  if (init_count == 0) {
    nni_sock_closeall();
    nni_sp_tran_sys_fini();
    do {
      do {
        do {
          _Var1 = nni_aio_sys_drain();
        } while (_Var1);
        _Var1 = nni_taskq_sys_drain();
      } while (_Var1);
      _Var1 = nni_reap_sys_drain();
    } while (_Var1);
    nni_tls_sys_fini();
    nni_taskq_sys_fini();
    nni_aio_sys_fini();
    nni_id_map_sys_fini();
    nni_reap_sys_fini();
    nni_plat_fini();
  }
  nni_atomic_flag_reset(&init_busy);
  return;
}

Assistant:

void
nng_fini(void)
{
	while (nni_atomic_flag_test_and_set(&init_busy)) {
		continue;
	}
	init_count--;
	if (init_count > 0) {
		nni_atomic_flag_reset(&init_busy);
		return;
	}
	nni_sock_closeall();
	nni_sp_tran_sys_fini();

	// Drain everything. This is important because some of
	// these subsystems can dispatch things to other ones.
	// So we need them *all* to be empty before proceeding.
	while ((nni_aio_sys_drain() || nni_taskq_sys_drain() ||
	    nni_reap_sys_drain())) {
		continue;
	}
	nni_tls_sys_fini();
	nni_taskq_sys_fini();
	nni_aio_sys_fini();
	nni_id_map_sys_fini();
	nni_reap_sys_fini(); // must be near the end
	nni_plat_fini();
	nni_atomic_flag_reset(&init_busy);
}